

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O2

CURLcode Curl_ntlm_core_mk_lmv2_resp
                   (uchar *ntlmv2hash,uchar *challenge_client,uchar *challenge_server,uchar *lmresp)

{
  CURLcode CVar1;
  uchar hmac_output [16];
  uchar data [16];
  
  data._0_8_ = *(undefined8 *)challenge_server;
  data._8_8_ = *(undefined8 *)challenge_client;
  CVar1 = Curl_hmacit(Curl_HMAC_MD5,ntlmv2hash,0x10,data,0x10,hmac_output);
  if (CVar1 == CURLE_OK) {
    *(undefined8 *)lmresp = hmac_output._0_8_;
    *(undefined8 *)(lmresp + 8) = hmac_output._8_8_;
    *(undefined8 *)(lmresp + 0x10) = *(undefined8 *)challenge_client;
  }
  return CVar1;
}

Assistant:

CURLcode  Curl_ntlm_core_mk_lmv2_resp(unsigned char *ntlmv2hash,
                                      unsigned char *challenge_client,
                                      unsigned char *challenge_server,
                                      unsigned char *lmresp)
{
  unsigned char data[16];
  unsigned char hmac_output[16];
  CURLcode result = CURLE_OK;

  memcpy(&data[0], challenge_server, 8);
  memcpy(&data[8], challenge_client, 8);

  result = Curl_hmacit(Curl_HMAC_MD5, ntlmv2hash, 16, &data[0], 16,
                       hmac_output);
  if(result)
    return result;

  /* Concatenate the HMAC MD5 output  with the client nonce */
  memcpy(lmresp, hmac_output, 16);
  memcpy(lmresp + 16, challenge_client, 8);

  return result;
}